

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_s2c_ecdsa_data_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0xfeefd675;
  sha->s[1] = 0x73166c99;
  sha->s[2] = 0xe2309cb8;
  sha->s[3] = 0x6d458113;
  sha->s[4] = 0x1d3a512;
  sha->s[5] = 0xe18112;
  sha->s[6] = 0x37ee0874;
  sha->s[7] = 0x421fc55f;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_s2c_ecdsa_data_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0xfeefd675ul;
    sha->s[1] = 0x73166c99ul;
    sha->s[2] = 0xe2309cb8ul;
    sha->s[3] = 0x6d458113ul;
    sha->s[4] = 0x01d3a512ul;
    sha->s[5] = 0x00e18112ul;
    sha->s[6] = 0x37ee0874ul;
    sha->s[7] = 0x421fc55ful;

    sha->bytes = 64;
}